

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_bucket_id_mapping.c
# Opt level: O3

double dds_get_bucket_value(dds_bucket_id_mapping *bid_mapping,int bid)

{
  mapping_type mVar1;
  double dVar2;
  double dVar3;
  
  mVar1 = bid_mapping->type;
  dVar2 = exp((double)bid * bid_mapping->log_gamma);
  if (mVar1 == LOG_LOWER) {
    dVar3 = bid_mapping->alpha + 1.0;
  }
  else {
    dVar3 = 1.0 - bid_mapping->alpha;
  }
  return dVar2 * dVar3;
}

Assistant:

double dds_get_bucket_value(struct dds_bucket_id_mapping *bid_mapping, int bid) {
    double value;
    switch (bid_mapping->type) {
        case LOG_UPPER:
            value = exp(bid * bid_mapping->log_gamma) * (1 - bid_mapping->alpha);
            break;
        case LOG_LOWER:
            value = exp(bid * bid_mapping->log_gamma) * (1 + bid_mapping->alpha);
            break;
        default:
            value = exp(bid * bid_mapping->log_gamma) * (1 - bid_mapping->alpha);
    }

    return value;
}